

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O3

void mocker::anon_unknown_0::genArithBinary
               (Section *text,FuncSelectionContext *ctx,
               shared_ptr<mocker::ir::ArithBinaryInst> *inst)

{
  _Hash_node_base *p_Var1;
  element_type *peVar2;
  undefined8 uVar3;
  int iVar4;
  OpType *args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  shared_ptr<mocker::nasm::Register> *args_1;
  undefined1 *puVar5;
  shared_ptr<mocker::nasm::Register> raxCopy;
  shared_ptr<mocker::nasm::Addr> dest;
  shared_ptr<mocker::nasm::Register> divisor;
  shared_ptr<mocker::nasm::Addr> lhs;
  shared_ptr<mocker::nasm::Register> rdxCopy;
  undefined1 local_b8 [16];
  undefined1 local_a8 [40];
  __buckets_ptr pp_Stack_80;
  __node_base local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  float local_40;
  __node_base local_38;
  
  peVar2 = (inst->super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar2->op - Shl < 2) {
    local_a8._0_8_ =
         (peVar2->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8._8_8_ =
         (peVar2->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
      }
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)&stack0xffffffffffffffc0,(shared_ptr<mocker::ir::Addr> *)ctx)
    ;
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_b8,
               (shared_ptr<mocker::nasm::Addr> *)&stack0xffffffffffffffc0);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_50,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>&>
              ((nasm *)local_a8,(shared_ptr<mocker::nasm::Addr> *)local_50);
    uVar3 = local_a8._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    if ((element_type *)uVar3 == (element_type *)0x0) {
      local_a8._0_8_ = (_Hash_node_base *)(local_a8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
      FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_60,(string *)ctx);
      if ((_Hash_node_base *)local_a8._0_8_ != (_Hash_node_base *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,
                        (ulong)((long)(_Hash_node_base **)local_a8._16_8_ + 1));
      }
      if ((nasm::rcx()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rcx()::res), iVar4 != 0)
         ) {
        nasm::rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rcx::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rcx::res,
                   (allocator<mocker::nasm::Register> *)local_a8,(char (*) [4])"rcx");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rcx::res,&__dso_handle);
        __cxa_guard_release(&nasm::rcx()::res);
      }
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                (text,(shared_ptr<mocker::nasm::Register> *)local_60,&nasm::rcx::res);
      if ((nasm::rcx()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rcx()::res), iVar4 != 0)
         ) {
        nasm::rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rcx::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rcx::res,
                   (allocator<mocker::nasm::Register> *)local_a8,(char (*) [4])"rcx");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rcx::res,&__dso_handle);
        __cxa_guard_release(&nasm::rcx()::res);
      }
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
                (text,&nasm::rcx::res,(shared_ptr<mocker::nasm::Addr> *)local_50);
      local_a8._0_8_ =
           CONCAT44(local_a8._4_4_,
                    (uint)(((inst->
                            super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->op == Shr)) | 6;
      if ((nasm::rcx()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rcx()::res), iVar4 != 0)
         ) {
        nasm::rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rcx::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rcx::res,
                   (allocator<mocker::nasm::Register> *)&local_70,(char (*) [4])"rcx");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rcx::res,&__dso_handle);
        __cxa_guard_release(&nasm::rcx()::res);
      }
      nasm::Section::
      emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
                (text,(OpType *)local_a8,(shared_ptr<mocker::nasm::Addr> *)local_b8,&nasm::rcx::res)
      ;
      if ((nasm::rcx()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rcx()::res), iVar4 != 0)
         ) {
        nasm::rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rcx::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rcx::res,
                   (allocator<mocker::nasm::Register> *)local_a8,(char (*) [4])"rcx");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::rcx::res,&__dso_handle);
        __cxa_guard_release(&nasm::rcx()::res);
      }
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
                (text,&nasm::rcx::res,(shared_ptr<mocker::nasm::Register> *)local_60);
      goto LAB_00119c08;
    }
    local_a8._0_8_ =
         CONCAT44(local_a8._4_4_,
                  (uint)(((inst->
                          super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->op == Shr)) | 6;
    nasm::Section::
    emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
              (text,(OpType *)local_a8,(shared_ptr<mocker::nasm::Addr> *)local_b8,
               (shared_ptr<mocker::nasm::Addr> *)local_50);
  }
  else {
    if (1 < peVar2->op - Div) {
      if (((anonymous_namespace)::
           genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
           ::opMp == '\0') &&
         (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
                                       ::opMp), iVar4 != 0)) {
        local_b8._0_8_ = local_a8;
        local_a8._0_8_ = (_Hash_node_base *)0x300000005;
        local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400000006;
        local_a8._16_8_ = (_Hash_node_base *)0x500000007;
        local_a8._24_8_ = 0x100000001;
        local_a8._32_8_ = (__node_base_ptr)0x0;
        pp_Stack_80 = (__buckets_ptr)0x200000002;
        local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
        SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::SmallMap
                  (&genArithBinary::opMp,
                   (initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>_>
                    *)local_b8);
        __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>
                     ::~SmallMap,&genArithBinary::opMp,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             genArithBinary(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::ArithBinaryInst>const&)
                             ::opMp);
      }
      peVar2 = (inst->super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_b8._0_8_ =
           (peVar2->super_Definition).dest.
           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b8._8_8_ =
           (peVar2->super_Definition).dest.
           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_)->_M_use_count + 1;
        }
      }
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Addr> *)ctx);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                (text,(shared_ptr<mocker::nasm::Addr> *)local_a8,
                 (shared_ptr<mocker::nasm::Addr> *)local_b8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      local_40 = (float)((inst->
                         super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->op;
      args = SmallMap<mocker::ir::ArithBinaryInst::OpType,_mocker::nasm::BinaryInst::OpType>::at
                       (&genArithBinary::opMp,(OpType *)&stack0xffffffffffffffc0);
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_b8,(shared_ptr<mocker::ir::Addr> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType_const&,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                (text,args,(shared_ptr<mocker::nasm::Addr> *)local_a8,
                 (shared_ptr<mocker::nasm::Addr> *)local_b8);
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
      }
      goto LAB_00119ceb;
    }
    p_Var1 = (_Hash_node_base *)(local_a8 + 0x10);
    local_a8._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_b8,(string *)ctx);
    if ((_Hash_node_base *)local_a8._0_8_ != p_Var1) {
      operator_delete((void *)local_a8._0_8_,(ulong)((long)(_Hash_node_base **)local_a8._16_8_ + 1))
      ;
    }
    local_a8._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
    FuncSelectionContext::newVirtualReg
              ((FuncSelectionContext *)&stack0xffffffffffffffc0,(string *)ctx);
    if ((_Hash_node_base *)local_a8._0_8_ != p_Var1) {
      operator_delete((void *)local_a8._0_8_,(ulong)((long)(_Hash_node_base **)local_a8._16_8_ + 1))
      ;
    }
    if ((nasm::rdx()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rdx()::res), iVar4 != 0))
    {
      nasm::rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rdx::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rdx::res,(allocator<mocker::nasm::Register> *)local_a8,
                 (char (*) [4])"rdx");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rdx::res,&__dso_handle);
      __cxa_guard_release(&nasm::rdx()::res);
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffc0,&nasm::rdx::res);
    if ((nasm::rax()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rax()::res), iVar4 != 0))
    {
      nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rax::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rax::res,(allocator<mocker::nasm::Register> *)local_a8,
                 (char (*) [4])"rax");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rax::res,&__dso_handle);
      __cxa_guard_release(&nasm::rax()::res);
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Register> *)local_b8,&nasm::rax::res);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_50,(shared_ptr<mocker::ir::Addr> *)ctx);
    if ((nasm::rax()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rax()::res), iVar4 != 0))
    {
      nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rax::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rax::res,(allocator<mocker::nasm::Register> *)local_a8,
                 (char (*) [4])"rax");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rax::res,&__dso_handle);
      __cxa_guard_release(&nasm::rax()::res);
    }
    args_1 = &nasm::rax::res;
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
              (text,&nasm::rax::res,(shared_ptr<mocker::nasm::Addr> *)local_50);
    nasm::Section::emplaceInst<mocker::nasm::Cqo>(text);
    local_a8._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_60,(string *)ctx);
    if ((_Hash_node_base *)local_a8._0_8_ != p_Var1) {
      operator_delete((void *)local_a8._0_8_,(ulong)((long)(_Hash_node_base **)local_a8._16_8_ + 1))
      ;
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
              (text,(shared_ptr<mocker::nasm::Register> *)local_60,
               (shared_ptr<mocker::nasm::Addr> *)local_a8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    nasm::Section::emplaceInst<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Register>&>
              (text,(shared_ptr<mocker::nasm::Register> *)local_60);
    peVar2 = (inst->super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_70._M_nxt =
         (_Hash_node_base *)
         (peVar2->super_Definition).dest.
         super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68 = (peVar2->super_Definition).dest.
               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_68->_M_use_count = local_68->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_68->_M_use_count = local_68->_M_use_count + 1;
      }
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Addr> *)ctx);
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (((inst->super___shared_ptr<mocker::ir::ArithBinaryInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ->op == Mod) {
      args_1 = &nasm::rdx::res;
      if (nasm::rdx()::res == '\0') {
        puVar5 = &nasm::rdx()::res;
        iVar4 = __cxa_guard_acquire(&nasm::rdx()::res);
        if (iVar4 != 0) {
          nasm::rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          args_1 = &nasm::rdx::res;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::rdx::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::rdx::res,
                     (allocator<mocker::nasm::Register> *)&local_70,(char (*) [4])"rdx");
LAB_00119fd9:
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,args_1,&__dso_handle);
          __cxa_guard_release(puVar5);
        }
      }
    }
    else if (nasm::rax()::res == '\0') {
      puVar5 = &nasm::rax()::res;
      iVar4 = __cxa_guard_acquire(&nasm::rax()::res);
      if (iVar4 != 0) {
        nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        args_1 = &nasm::rax::res;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::rax::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::rax::res,
                   (allocator<mocker::nasm::Register> *)&local_70,(char (*) [4])"rax");
        goto LAB_00119fd9;
      }
    }
    else {
      args_1 = &nasm::rax::res;
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_a8,args_1);
    if ((nasm::rdx()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rdx()::res), iVar4 != 0))
    {
      nasm::rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rdx::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rdx::res,(allocator<mocker::nasm::Register> *)&local_70,
                 (char (*) [4])"rdx");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rdx::res,&__dso_handle);
      __cxa_guard_release(&nasm::rdx()::res);
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
              (text,&nasm::rdx::res,(shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffc0);
    if ((nasm::rax()::res == '\0') && (iVar4 = __cxa_guard_acquire(&nasm::rax()::res), iVar4 != 0))
    {
      nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::rax::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::rax::res,(allocator<mocker::nasm::Register> *)&local_70,
                 (char (*) [4])"rax");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::rax::res,&__dso_handle);
      __cxa_guard_release(&nasm::rax()::res);
    }
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
              (text,&nasm::rax::res,(shared_ptr<mocker::nasm::Register> *)local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
LAB_00119c08:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
  }
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_nxt);
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
  }
LAB_00119ceb:
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return;
}

Assistant:

void genArithBinary(nasm::Section &text, FuncSelectionContext &ctx,
                    const std::shared_ptr<ir::ArithBinaryInst> &inst) {
  if (inst->getOp() == ir::ArithBinaryInst::Mod ||
      inst->getOp() == ir::ArithBinaryInst::Div) {
    auto raxCopy = ctx.newVirtualReg(), rdxCopy = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(rdxCopy, nasm::rdx());
    text.emplaceInst<nasm::Mov>(raxCopy, nasm::rax());

    auto lhs = ctx.getIrAddr(inst->getLhs());
    text.emplaceInst<nasm::Mov>(nasm::rax(), lhs);
    text.emplaceInst<nasm::Cqo>();
    //    text.emplaceInst<nasm::Mov>(nasm::rdx(),
    //                                std::make_shared<nasm::NumericConstant>(0));

    auto divisor = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(divisor, ctx.getIrAddr(inst->getRhs()));
    text.emplaceInst<nasm::IDiv>(divisor);

    auto dest = ctx.getIrAddr(inst->getDest());
    if (inst->getOp() == ir::ArithBinaryInst::Mod)
      text.emplaceInst<nasm::Mov>(dest, nasm::rdx());
    else
      text.emplaceInst<nasm::Mov>(dest, nasm::rax());
    text.emplaceInst<nasm::Mov>(nasm::rdx(), rdxCopy);
    text.emplaceInst<nasm::Mov>(nasm::rax(), raxCopy);
    return;
  }

  if (inst->getOp() == ir::ArithBinaryInst::Shr ||
      inst->getOp() == ir::ArithBinaryInst::Shl) {
    auto dest = ctx.getIrAddr(inst->getDest());
    auto lhs = ctx.getIrAddr(inst->getLhs());
    text.emplaceInst<nasm::Mov>(dest, lhs);
    auto rhs = ctx.getIrAddr(inst->getRhs());

    if (nasm::dyc<nasm::NumericConstant>(rhs)) {
      text.emplaceInst<nasm::BinaryInst>(
          inst->getOp() == ir::ArithBinaryInst::Shr ? nasm::BinaryInst::Sar
                                                    : nasm::BinaryInst::Sal,
          dest, rhs);
      return;
    }

    auto rcxCopy = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(rcxCopy, nasm::rcx());
    text.emplaceInst<nasm::Mov>(nasm::rcx(), rhs);
    text.emplaceInst<nasm::BinaryInst>(inst->getOp() == ir::ArithBinaryInst::Shr
                                           ? nasm::BinaryInst::Sar
                                           : nasm::BinaryInst::Sal,
                                       dest, nasm::rcx());
    text.emplaceInst<nasm::Mov>(nasm::rcx(), rcxCopy);
    return;
  }

  static const SmallMap<ir::ArithBinaryInst::OpType, nasm::BinaryInst::OpType>
      opMp{
          {ir::ArithBinaryInst::Add, nasm::BinaryInst::Add},
          {ir::ArithBinaryInst::Sub, nasm::BinaryInst::Sub},
          {ir::ArithBinaryInst::Mul, nasm::BinaryInst::Mul},
          {ir::ArithBinaryInst::BitAnd, nasm::BinaryInst::BitAnd},
          {ir::ArithBinaryInst::BitOr, nasm::BinaryInst::BitOr},
          {ir::ArithBinaryInst::Xor, nasm::BinaryInst::Xor},
      };
  auto dest = ctx.getIrAddr(inst->getDest());
  text.emplaceInst<nasm::Mov>(dest, ctx.getIrAddr(inst->getLhs()));
  text.emplaceInst<nasm::BinaryInst>(opMp.at(inst->getOp()), dest,
                                     ctx.getIrAddr(inst->getRhs()));
}